

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool mz_zip_writer_add_cfile
                  (mz_zip_archive *pZip,char *pArchive_name,FILE *pSrc_file,mz_uint64 size_to_add,
                  time_t *pFile_time,void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  char cVar1;
  mz_zip_internal_state *pmVar2;
  int iVar3;
  mz_uint16 filename_size;
  undefined1 uVar4;
  mz_uint16 extra_size;
  mz_bool mVar5;
  tdefl_status tVar6;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  mz_uint8 *ptr;
  tdefl_compressor *d;
  size_t sVar11;
  mz_ulong mVar12;
  size_t sVar13;
  uint uVar14;
  tdefl_flush flush;
  mz_uint8 mVar16;
  mz_uint64 *pLocal_header_ofs;
  mz_uint64 *pmVar15;
  mz_uint64 *pmVar17;
  mz_uint64 mVar18;
  mz_uint64 *pmVar19;
  mz_uint8 mVar20;
  mz_uint16 method;
  mz_uint32 uncomp_crc32;
  mz_uint64 mVar21;
  ulong uVar22;
  mz_uint8 *pBuf;
  bool bVar23;
  bool bVar24;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  uint local_104;
  FILE *local_100;
  mz_uint64 local_f8;
  mz_uint64 uncomp_size;
  mz_uint64 comp_size;
  uint local_dc;
  mz_zip_writer_add_state state;
  mz_uint64 local_dir_header_ofs;
  mz_uint8 local_dir_header [30];
  mz_uint8 extra_data [28];
  mz_uint32 mVar7;
  
  dos_time = 0;
  dos_date = 0;
  local_f8 = pZip->m_archive_size;
  comp_size = 0;
  uVar14 = 6;
  if (-1 < (int)level_and_flags) {
    uVar14 = level_and_flags;
  }
  pmVar2 = pZip->m_pState;
  if ((((pmVar2 == (mz_zip_internal_state *)0x0) || (pArchive_name == (char *)0x0)) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
     (local_104 = uVar14 & 0xf, pComment == (void *)0x0 && comment_size != 0 || 10 < local_104)) {
LAB_0014d575:
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    return 0;
  }
  if ((size_to_add >> 0x20 != 0) && (pmVar2->m_zip64 == 0)) {
    pmVar2->m_zip64 = 1;
  }
  if ((uVar14 >> 10 & 1) != 0) goto LAB_0014d575;
  if (*pArchive_name == '/') {
LAB_0014d563:
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  local_dc = (uint)((level_and_flags >> 0x10 & 1) == 0) << 0xb | 8;
  for (pcVar8 = pArchive_name; cVar1 = *pcVar8, cVar1 != '\0'; pcVar8 = pcVar8 + 1) {
    if ((cVar1 == ':') || (cVar1 == '\\')) goto LAB_0014d563;
  }
  if (pmVar2->m_zip64 == 0) {
    if (pZip->m_total_files == 0xffff) {
      pmVar2->m_zip64 = 1;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  local_100 = (FILE *)pSrc_file;
  uncomp_size = size_to_add;
  sVar9 = strlen(pArchive_name);
  if (0xffff < sVar9) goto LAB_0014d563;
  iVar3 = (int)pZip->m_file_offset_alignment;
  uVar14 = iVar3 - 1;
  uVar22 = (ulong)(iVar3 - (uVar14 & (uint)local_f8) & uVar14);
  if (pZip->m_file_offset_alignment == 0) {
    uVar22 = 0;
  }
  sVar10 = (pmVar2->m_central_dir).m_size;
  if (0xfffffffe < sVar9 + comment_size + sVar10 + 0x4a) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  if ((pmVar2->m_zip64 == 0) &&
     (uVar22 + (ulong)user_extra_data_len + (ulong)comment_size + (ulong)user_extra_data_central_len
               + local_f8 + sVar9 * 2 + sVar10 + 0x472 >> 0x20 != 0)) {
    pmVar2->m_zip64 = 1;
  }
  if (pFile_time != (time_t *)0x0) {
    mz_zip_time_t_to_dos_time(*pFile_time,&dos_time,&dos_date);
  }
  mVar21 = local_f8;
  if (uncomp_size < 4) {
    local_104 = 0;
  }
  mVar5 = mz_zip_writer_write_zeros(pZip,local_f8,(mz_uint32)uVar22);
  if (mVar5 == 0) goto LAB_0014dbb1;
  uVar22 = mVar21 + uVar22;
  local_dir_header_ofs = uVar22;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & uVar22) != 0)) {
    __assert_fail("(cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                  ,0x1900,
                  "mz_bool mz_zip_writer_add_cfile(mz_zip_archive *, const char *, FILE *, mz_uint64, const time_t *, const void *, mz_uint16, mz_uint, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  bVar23 = uncomp_size != 0;
  bVar24 = local_104 != 0;
  method = (ushort)(bVar24 && bVar23) << 3;
  local_dir_header[0] = '\0';
  local_dir_header[1] = '\0';
  local_dir_header[2] = '\0';
  local_dir_header[3] = '\0';
  local_dir_header[4] = '\0';
  local_dir_header[5] = '\0';
  local_dir_header[6] = '\0';
  local_dir_header[7] = '\0';
  local_dir_header[8] = '\0';
  local_dir_header[9] = '\0';
  local_dir_header[10] = '\0';
  local_dir_header[0xb] = '\0';
  local_dir_header[0xc] = '\0';
  local_dir_header[0xd] = '\0';
  local_dir_header[0xe] = '\0';
  local_dir_header[0xf] = '\0';
  local_dir_header[0x10] = '\0';
  local_dir_header[0x11] = '\0';
  local_dir_header[0x12] = '\0';
  local_dir_header[0x13] = '\0';
  local_dir_header[0x14] = '\0';
  local_dir_header[0x15] = '\0';
  local_dir_header[0x16] = '\0';
  local_dir_header[0x17] = '\0';
  local_dir_header[0x18] = '\0';
  local_dir_header[0x19] = '\0';
  local_dir_header[0x1a] = '\0';
  local_dir_header[0x1b] = '\0';
  local_dir_header[0x1c] = '\0';
  local_dir_header[0x1d] = '\0';
  mVar16 = (mz_uint8)(local_dc >> 8);
  mVar20 = (mz_uint8)method;
  filename_size = (mz_uint16)sVar9;
  if (pmVar2->m_zip64 == 0) {
    if ((comp_size._4_4_ != 0) || (uVar22 >> 0x20 != 0)) {
      if (pZip == (mz_zip_archive *)0x0) {
        return 0;
      }
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    local_dir_header[4] = '\x14';
    if (!bVar24 || !bVar23) {
      local_dir_header[4] = '\0';
    }
    builtin_memcpy(local_dir_header,"PK\x03\x04",4);
    local_dir_header[5] = '\0';
    local_dir_header[6] = '\b';
    local_dir_header[7] = mVar16;
    local_dir_header[9] = '\0';
    local_dir_header[10] = (mz_uint8)dos_time;
    local_dir_header[0xb] = (mz_uint8)(dos_time >> 8);
    local_dir_header[0xc] = (mz_uint8)dos_date;
    local_dir_header[0xd] = (mz_uint8)(dos_date >> 8);
    local_dir_header[0xe] = '\0';
    local_dir_header[0xf] = '\0';
    local_dir_header[0x10] = '\0';
    local_dir_header[0x11] = '\0';
    local_dir_header[0x12] = '\0';
    local_dir_header[0x13] = '\0';
    local_dir_header[0x14] = '\0';
    local_dir_header[0x15] = '\0';
    local_dir_header._22_8_ =
         (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                         CONCAT12((char)user_extra_data_len,filename_size)) << 0x20;
    local_dir_header[8] = mVar20;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar22,local_dir_header,0x1e);
    if (sVar10 != 0x1e) goto LAB_0014dbb1;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar22 + 0x1e,pArchive_name,sVar9);
    if (sVar10 != sVar9) goto LAB_0014dbb1;
    mVar21 = uVar22 + 0x1e + sVar9;
    pBuf = (mz_uint8 *)0x0;
    uVar14 = 0;
  }
  else {
    if ((uncomp_size < 0xffffffff) && (uVar22 < 0xffffffff)) {
      pBuf = (mz_uint8 *)0x0;
      uVar14 = 0;
    }
    else {
      pmVar19 = (mz_uint64 *)0x0;
      pmVar15 = &uncomp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar15 = pmVar19;
      }
      pmVar17 = &comp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar17 = pmVar19;
      }
      pLocal_header_ofs = &local_dir_header_ofs;
      if (uVar22 < 0xffffffff) {
        pLocal_header_ofs = pmVar19;
      }
      pBuf = extra_data;
      uVar14 = mz_zip_writer_create_zip64_extra_data(pBuf,pmVar15,pmVar17,pLocal_header_ofs);
      mVar16 = (mz_uint8)(local_dc >> 8);
    }
    local_dir_header[4] = '\x14';
    if (!bVar24 || !bVar23) {
      local_dir_header[4] = '\0';
    }
    builtin_memcpy(local_dir_header,"PK\x03\x04",4);
    local_dir_header[5] = '\0';
    local_dir_header[6] = '\b';
    local_dir_header[7] = mVar16;
    local_dir_header[9] = '\0';
    local_dir_header[10] = (mz_uint8)dos_time;
    local_dir_header[0xb] = (mz_uint8)(dos_time >> 8);
    local_dir_header[0xc] = (mz_uint8)dos_date;
    local_dir_header[0xd] = (mz_uint8)(dos_date >> 8);
    local_dir_header[0xe] = '\0';
    local_dir_header[0xf] = '\0';
    local_dir_header[0x10] = '\0';
    local_dir_header[0x11] = '\0';
    local_dir_header[0x12] = '\0';
    local_dir_header[0x13] = '\0';
    local_dir_header[0x14] = '\0';
    local_dir_header[0x15] = '\0';
    local_dir_header._22_8_ =
         (ulong)CONCAT13((char)(uVar14 + user_extra_data_len >> 8),
                         CONCAT12((char)(uVar14 + user_extra_data_len),filename_size)) << 0x20;
    local_dir_header[8] = mVar20;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar22,local_dir_header,0x1e);
    if (sVar10 != 0x1e) goto LAB_0014dbb1;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar22 + 0x1e,pArchive_name,sVar9);
    if (sVar10 != sVar9) goto LAB_0014dbb1;
    mVar21 = uVar22 + 0x1e + sVar9;
    uVar22 = (ulong)uVar14;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar21,extra_data,uVar22);
    if (sVar10 != uVar22) goto LAB_0014dbb1;
    mVar21 = mVar21 + uVar22;
  }
  extra_size = (mz_uint16)uVar14;
  if (user_extra_data_len != 0) {
    uVar22 = (ulong)user_extra_data_len;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar21,user_extra_data,uVar22);
    if (sVar10 != uVar22) {
LAB_0014dbb1:
      if (pZip == (mz_zip_archive *)0x0) {
        return 0;
      }
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    mVar21 = mVar21 + uVar22;
  }
  mVar18 = uncomp_size;
  local_f8 = mVar21;
  if (uncomp_size == 0) {
    uncomp_crc32 = 0;
  }
  else {
    ptr = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
    if (ptr == (mz_uint8 *)0x0) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      }
      bVar23 = false;
      uncomp_crc32 = 0;
    }
    else {
      if (local_104 == 0) {
        mVar12 = 0;
        do {
          uncomp_crc32 = (mz_uint32)mVar12;
          if (mVar18 == 0) {
            comp_size = uncomp_size;
            goto LAB_0014dcad;
          }
          sVar9 = 0x10000;
          if (mVar18 < 0x10000) {
            sVar9 = mVar18;
          }
          sVar11 = fread(ptr,1,sVar9,local_100);
          if ((sVar11 == sVar9) &&
             (sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_f8,ptr,sVar9), sVar10 == sVar9)) {
            mVar12 = mz_crc32(mVar12 & 0xffffffff,ptr,sVar9);
            mVar18 = mVar18 - sVar9;
            local_f8 = local_f8 + sVar9;
            bVar23 = true;
          }
          else {
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
            if (pZip != (mz_zip_archive *)0x0) {
              pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
            }
            bVar23 = false;
          }
          uncomp_crc32 = (mz_uint32)mVar12;
        } while (bVar23);
      }
      else {
        d = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
        if (d == (tdefl_compressor *)0x0) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
          if (pZip != (mz_zip_archive *)0x0) {
            pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
          }
          bVar23 = false;
          uncomp_crc32 = 0;
        }
        else {
          state.m_cur_archive_file_ofs = local_f8;
          uVar22 = 10;
          if ((int)local_104 < 10) {
            uVar22 = (ulong)local_104;
          }
          state.m_comp_size = 0;
          state.m_pZip = pZip;
          tdefl_init(d,mz_zip_writer_add_put_buf_callback,&state,
                     (uint)(local_104 < 4) << 0xe |
                     tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar22]);
          mVar12 = 0;
          local_104 = 0;
          do {
            sVar9 = 0x10000;
            if (mVar18 < 0x10000) {
              sVar9 = mVar18;
            }
            sVar11 = fread(ptr,1,sVar9,local_100);
            if (sVar11 == sVar9) {
              mVar12 = mz_crc32(mVar12 & 0xffffffff,ptr,sVar9);
              if (pZip->m_pNeeds_keepalive == (mz_file_needs_keepalive)0x0) {
                flush = TDEFL_NO_FLUSH;
              }
              else {
                mVar5 = (*pZip->m_pNeeds_keepalive)(pZip->m_pIO_opaque);
                flush = (uint)(mVar5 != 0) * 3;
              }
              mVar18 = mVar18 - sVar9;
              if (mVar18 == 0) {
                flush = TDEFL_FINISH;
              }
              tVar6 = tdefl_compress_buffer(d,ptr,sVar9,flush);
              if (tVar6 == TDEFL_STATUS_OKAY) {
                bVar23 = true;
              }
              else {
                if (tVar6 != TDEFL_STATUS_DONE) {
                  if (pZip != (mz_zip_archive *)0x0) {
                    pZip->m_last_error = MZ_ZIP_COMPRESSION_FAILED;
                  }
                  goto LAB_0014db57;
                }
                bVar23 = false;
                local_104 = 1;
              }
            }
            else {
              if (pZip != (mz_zip_archive *)0x0) {
                pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
              }
LAB_0014db57:
              bVar23 = false;
            }
            uncomp_crc32 = (mz_uint32)mVar12;
          } while (bVar23);
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,d);
          if (local_104 == 0) {
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
            bVar23 = false;
          }
          else {
            local_f8 = state.m_cur_archive_file_ofs;
            comp_size = state.m_comp_size;
            bVar23 = true;
          }
        }
        if (bVar23) {
LAB_0014dcad:
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
          bVar23 = true;
          goto LAB_0014dcbd;
        }
      }
      bVar23 = false;
    }
LAB_0014dcbd:
    if (!bVar23) {
      return 0;
    }
  }
  mVar18 = state.m_cur_archive_file_ofs;
  mVar21 = local_f8;
  state.m_pZip = (mz_zip_archive *)
                 CONCAT17((char)(uncomp_crc32 >> 0x18),
                          CONCAT16((char)(uncomp_crc32 >> 0x10),
                                   CONCAT15((char)(uncomp_crc32 >> 8),
                                            CONCAT14((char)uncomp_crc32,0x8074b50))));
  uVar4 = (undefined1)(uncomp_size >> 0x18);
  if (pBuf == (mz_uint8 *)0x0) {
    if (comp_size >> 0x20 != 0) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      }
      bVar23 = false;
      goto LAB_0014ddc3;
    }
    state.m_cur_archive_file_ofs._7_1_ = SUB81(mVar18,7);
    state.m_cur_archive_file_ofs._0_7_ =
         CONCAT16((char)(uncomp_size >> 0x10),
                  CONCAT15((char)(uncomp_size >> 8),CONCAT14((char)uncomp_size,(int)comp_size)));
    sVar10 = 0x10;
    pmVar15 = &state.m_cur_archive_file_ofs;
  }
  else {
    state.m_cur_archive_file_ofs = comp_size;
    state.m_comp_size._0_7_ = (undefined7)uncomp_size;
    uVar4 = (undefined1)(uncomp_size >> 0x38);
    sVar10 = 0x18;
    pmVar15 = &state.m_comp_size;
  }
  *(undefined1 *)((long)pmVar15 + 7) = uVar4;
  sVar13 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_f8,&state,sVar10);
  bVar23 = sVar13 == sVar10;
  sVar13 = 0;
  if (bVar23) {
    sVar13 = sVar10;
  }
  local_f8 = mVar21 + sVar13;
LAB_0014ddc3:
  if (!bVar23) {
    return 0;
  }
  if (pBuf != (mz_uint8 *)0x0) {
    pmVar15 = (mz_uint64 *)0x0;
    pmVar19 = &uncomp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar19 = pmVar15;
    }
    pmVar17 = &comp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar17 = pmVar15;
    }
    if (0xfffffffe < local_dir_header_ofs) {
      pmVar15 = &local_dir_header_ofs;
    }
    mVar7 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar19,pmVar17,pmVar15);
    extra_size = (mz_uint16)mVar7;
  }
  mVar5 = mz_zip_writer_add_to_central_dir
                    (pZip,pArchive_name,filename_size,pBuf,extra_size,pComment,comment_size,
                     uncomp_size,comp_size,uncomp_crc32,method,(mz_uint16)local_dc,dos_time,dos_date
                     ,local_dir_header_ofs,0,user_extra_data_central,user_extra_data_central_len);
  if (mVar5 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = local_f8;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_add_cfile(mz_zip_archive *pZip, const char *pArchive_name, MZ_FILE *pSrc_file, mz_uint64 size_to_add, const MZ_TIME_T *pFile_time, const void *pComment, mz_uint16 comment_size, mz_uint level_and_flags,
                                const char *user_extra_data, mz_uint user_extra_data_len, const char *user_extra_data_central, mz_uint user_extra_data_central_len)
{
    mz_uint16 gen_flags = MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;
    mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
    mz_uint16 method = 0, dos_time = 0, dos_date = 0, ext_attributes = 0;
    mz_uint64 local_dir_header_ofs, cur_archive_file_ofs = pZip->m_archive_size, uncomp_size = size_to_add, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    mz_uint8 *pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_zip_internal_state *pState;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        gen_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;
    level = level_and_flags & 0xF;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if ((!pState->m_zip64) && (uncomp_size > MZ_UINT32_MAX))
    {
        /* Source file is too large for non-zip64 */
        /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        pState->m_zip64 = MZ_TRUE;
    }

    /* We could support this, but why? */
    if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    if (pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
    }

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64)
    {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE 
			+ archive_name_size + comment_size + user_extra_data_len + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 1024
			+ MZ_ZIP_DATA_DESCRIPTER_SIZE32 + user_extra_data_central_len) > 0xFFFFFFFF)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

#ifndef MINIZ_NO_TIME
    if (pFile_time)
    {
        mz_zip_time_t_to_dos_time(*pFile_time, &dos_time, &dos_date);
    }
#endif

    if (uncomp_size <= 3)
        level = 0;

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes))
    {
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += num_alignment_padding_bytes;
    local_dir_header_ofs = cur_archive_file_ofs;

    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    if (uncomp_size && level)
    {
        method = MZ_DEFLATED;
    }

    MZ_CLEAR_OBJ(local_dir_header);
    if (pState->m_zip64)
    {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX)
        {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, extra_size + user_extra_data_len, 0, 0, 0, method, gen_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += archive_name_size;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += extra_size;
    }
    else
    {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, user_extra_data_len, 0, 0, 0, method, gen_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += archive_name_size;
    }

    if (user_extra_data_len > 0)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len) != user_extra_data_len)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += user_extra_data_len;
    }

    if (uncomp_size)
    {
        mz_uint64 uncomp_remaining = uncomp_size;
        void *pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
        if (!pRead_buf)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!level)
        {
            while (uncomp_remaining)
            {
                mz_uint n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
                if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) || (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf, n) != n))
                {
                    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                }
                uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
                uncomp_remaining -= n;
                cur_archive_file_ofs += n;
            }
            comp_size = uncomp_size;
        }
        else
        {
            mz_bool result = MZ_FALSE;
            mz_zip_writer_add_state state;
            tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
            if (!pComp)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            }

            state.m_pZip = pZip;
            state.m_cur_archive_file_ofs = cur_archive_file_ofs;
            state.m_comp_size = 0;

            if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);
            }

            for (;;)
            {
                size_t in_buf_size = (mz_uint32)MZ_MIN(uncomp_remaining, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
                tdefl_status status;
                tdefl_flush flush = TDEFL_NO_FLUSH;

                if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                    break;
                }

                uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, in_buf_size);
                uncomp_remaining -= in_buf_size;

                if (pZip->m_pNeeds_keepalive != NULL && pZip->m_pNeeds_keepalive(pZip->m_pIO_opaque))
                    flush = TDEFL_FULL_FLUSH;

                status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size, uncomp_remaining ? flush : TDEFL_FINISH);
                if (status == TDEFL_STATUS_DONE)
                {
                    result = MZ_TRUE;
                    break;
                }
                else if (status != TDEFL_STATUS_OKAY)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
                    break;
                }
            }

            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

            if (!result)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return MZ_FALSE;
            }

            comp_size = state.m_comp_size;
            cur_archive_file_ofs = state.m_cur_archive_file_ofs;
        }

        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
    }

    {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL)
        {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else
        {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_footer, local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL)
    {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data, extra_size, pComment, comment_size,
                                          uncomp_size, comp_size, uncomp_crc32, method, gen_flags, dos_time, dos_date, local_dir_header_ofs, ext_attributes,
                                          user_extra_data_central, user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}